

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_Fill(FillForm1 Fill)

{
  uint8_t value;
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  Image local_68;
  ImageTemplate<unsigned_char> local_40;
  
  Unit_Test::intensityArray(&local_80,2);
  value = *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_68,value,0,0,&local_40);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  (*Fill)(&local_68,
          local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1]);
  bVar1 = Unit_Test::verifyImage
                    (&local_68,
                     local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1]);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_Fill(FillForm1 Fill)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image = uniformImage( intensity[0] );

        Fill( image, intensity[1] );

        return verifyImage( image, intensity[1] );
    }